

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O2

void close_connection(mg_connection *conn)

{
  _func_void_mg_connection_ptr *p_Var1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  int *piVar5;
  char *pcVar6;
  char *func;
  char *func_00;
  mg_connection *conn_1;
  ulong uVar7;
  linger linger;
  int error_code;
  socklen_t local_24;
  
  mg_lock_connection(conn);
  conn->must_close = 1;
  p_Var1 = (conn->phys_ctx->callbacks).connection_close;
  if ((p_Var1 != (_func_void_mg_connection_ptr *)0x0) && (conn->phys_ctx->context_type == 1)) {
    (*p_Var1)(conn);
  }
  (conn->request_info).conn_data = (void *)0x0;
  iVar4 = (conn->client).sock;
  if (iVar4 == -1) goto LAB_00112213;
  error_code = 0;
  local_24 = 4;
  uVar3 = fcntl64(iVar4,3,0);
  if (-1 < (int)uVar3) {
    fcntl64(iVar4,4,uVar3 & 0x7ffff7ff);
  }
  shutdown((conn->client).sock,1);
  pcVar6 = conn->dom_ctx->config[5];
  if (pcVar6 == (char *)0x0) {
    linger.l_onoff = 0;
    linger.l_linger = 0;
  }
  else {
    iVar4 = atoi(pcVar6);
    if (iVar4 < 0) {
      linger.l_onoff = 0;
      linger.l_linger = 0;
      if (iVar4 != -1) goto LAB_00112201;
    }
    else {
      linger.l_linger = (iVar4 + 999U) / 1000;
      linger.l_onoff = 1;
    }
    iVar4 = getsockopt((conn->client).sock,1,4,&error_code,&local_24);
    if (iVar4 == 0) {
      if ((error_code != 0x68) &&
         (iVar4 = setsockopt((conn->client).sock,1,0xd,&linger,8), iVar4 != 0)) {
        uVar7 = (ulong)linger & 0xffffffff;
        uVar2 = (ulong)linger >> 0x20;
        piVar5 = __errno_location();
        pcVar6 = strerror(*piVar5);
        mg_cry_internal_wrap
                  (conn,(mg_context *)0x0,func_00,(uint)pcVar6,
                   "%s: setsockopt(SOL_SOCKET SO_LINGER(%i,%i)) failed: %s",
                   "close_socket_gracefully",uVar7,uVar2,pcVar6);
      }
    }
    else {
      piVar5 = __errno_location();
      pcVar6 = strerror(*piVar5);
      mg_cry_internal_wrap
                (conn,(mg_context *)0x0,func,(uint)pcVar6,
                 "%s: getsockopt(SOL_SOCKET SO_ERROR) failed: %s","close_socket_gracefully",pcVar6);
    }
  }
LAB_00112201:
  close((conn->client).sock);
  (conn->client).sock = -1;
LAB_00112213:
  p_Var1 = (conn->phys_ctx->callbacks).connection_closed;
  if ((p_Var1 != (_func_void_mg_connection_ptr *)0x0) && (conn->phys_ctx->context_type == 1)) {
    (*p_Var1)(conn);
  }
  mg_unlock_connection(conn);
  return;
}

Assistant:

static void
close_connection(struct mg_connection *conn)
{
#if defined(USE_SERVER_STATS)
	conn->conn_state = 6; /* to close */
#endif

#if defined(USE_LUA) && defined(USE_WEBSOCKET)
	if (conn->lua_websocket_state) {
		lua_websocket_close(conn, conn->lua_websocket_state);
		conn->lua_websocket_state = NULL;
	}
#endif

	mg_lock_connection(conn);

	/* Set close flag, so keep-alive loops will stop */
	conn->must_close = 1;

	/* call the connection_close callback if assigned */
	if (conn->phys_ctx->callbacks.connection_close != NULL) {
		if (conn->phys_ctx->context_type == CONTEXT_SERVER) {
			conn->phys_ctx->callbacks.connection_close(conn);
		}
	}

	/* Reset user data, after close callback is called.
	 * Do not reuse it. If the user needs a destructor,
	 * it must be done in the connection_close callback. */
	mg_set_user_connection_data(conn, NULL);

#if defined(USE_SERVER_STATS)
	conn->conn_state = 7; /* closing */
#endif

#if defined(USE_MBEDTLS)
	if (conn->ssl != NULL) {
		mbed_ssl_close(conn->ssl);
		conn->ssl = NULL;
	}
#elif !defined(NO_SSL)
	if (conn->ssl != NULL) {
		/* Run SSL_shutdown twice to ensure completely close SSL connection
		 */
		SSL_shutdown(conn->ssl);
		SSL_free(conn->ssl);
		OPENSSL_REMOVE_THREAD_STATE();
		conn->ssl = NULL;
	}
#endif
	if (conn->client.sock != INVALID_SOCKET) {
#if defined(__ZEPHYR__)
		closesocket(conn->client.sock);
#else
		close_socket_gracefully(conn);
#endif
		conn->client.sock = INVALID_SOCKET;
	}

	/* call the connection_closed callback if assigned */
	if (conn->phys_ctx->callbacks.connection_closed != NULL) {
		if (conn->phys_ctx->context_type == CONTEXT_SERVER) {
			conn->phys_ctx->callbacks.connection_closed(conn);
		}
	}

	mg_unlock_connection(conn);

#if defined(USE_SERVER_STATS)
	conn->conn_state = 8; /* closed */
#endif
}